

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::EndDataSegmentInitExpr
          (BinaryReaderInterp *this,Index index)

{
  SharedValidator *this_00;
  InitExprKind IVar1;
  pointer pDVar2;
  u64 uVar3;
  undefined4 uVar4;
  Result RVar5;
  Location LStack_88;
  Var local_68;
  
  IVar1 = (this->init_expr_).kind;
  this_00 = &this->validator_;
  if (IVar1 == GlobalGet) {
    LStack_88.field_1.field_0.line = 0;
    LStack_88.field_1._4_8_ = 0;
    LStack_88.filename.data_ = (char *)0x0;
    LStack_88.filename.size_._0_4_ = 0;
    LStack_88.filename.size_._4_4_ = 0;
    Var::Var(&local_68,(this->init_expr_).field_1.i32_,&LStack_88);
    RVar5 = SharedValidator::OnDataSegmentInitExpr_GlobalGet
                      (this_00,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_68)
    ;
    Var::~Var(&local_68);
  }
  else if (IVar1 == I32) {
    RVar5 = SharedValidator::OnDataSegmentInitExpr_Const
                      (this_00,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                       (Type)0xffffffff);
  }
  else {
    RVar5 = SharedValidator::OnDataSegmentInitExpr_Other
                      (this_00,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
  }
  if (RVar5.enum_ != Error) {
    pDVar2 = (this->module_->datas).
             super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    *(undefined8 *)((long)&pDVar2[-1].offset.field_1 + 8) =
         *(undefined8 *)((long)&(this->init_expr_).field_1 + 8);
    uVar4 = *(undefined4 *)&(this->init_expr_).field_0x4;
    uVar3 = (this->init_expr_).field_1.i64_;
    pDVar2[-1].offset.kind = (this->init_expr_).kind;
    *(undefined4 *)&pDVar2[-1].offset.field_0x4 = uVar4;
    pDVar2[-1].offset.field_1.i64_ = uVar3;
  }
  return (Result)(uint)(RVar5.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::EndDataSegmentInitExpr(Index index) {
  switch (init_expr_.kind) {
    case InitExprKind::I32:
      CHECK_RESULT(validator_.OnDataSegmentInitExpr_Const(loc, ValueType::I32));
      break;

    case InitExprKind::GlobalGet:
      CHECK_RESULT(validator_.OnDataSegmentInitExpr_GlobalGet(
          loc, Var(init_expr_.index_)));
      break;

    default:
      CHECK_RESULT(validator_.OnDataSegmentInitExpr_Other(loc));
      break;
  }

  DataDesc& data = module_.datas.back();
  data.offset = init_expr_;
  return Result::Ok;
}